

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pages.c
# Opt level: O3

void * duckdb_je_pages_map(void *addr,size_t size,size_t alignment,_Bool *commit)

{
  ulong uVar1;
  void *addr_00;
  void *addr_01;
  _Bool *p_Var2;
  ulong size_00;
  
  p_Var2 = commit;
  addr_00 = os_pages_map(addr,size,(size_t)commit,commit);
  p_Var2 = (_Bool *)CONCAT71((int7)((ulong)p_Var2 >> 8),addr_00 == addr || addr_00 == (void *)0x0);
  if ((addr_00 != addr && addr_00 != (void *)0x0) && ((alignment - 1 & (ulong)addr_00) != 0)) {
    os_pages_unmap(addr_00,size);
    size_00 = (alignment + size) - duckdb_je_os_page;
    addr_00 = (void *)0x0;
    if (size <= size_00) {
      addr_01 = os_pages_map((void *)0x0,size_00,(size_t)commit,p_Var2);
      addr_00 = (void *)0x0;
      if (addr_01 != (void *)0x0) {
        addr_00 = (void *)(-alignment & (alignment - 1) + (long)addr_01);
        uVar1 = (long)addr_00 + (size - (long)addr_01);
        if ((long)addr_00 - (long)addr_01 != 0) {
          os_pages_unmap(addr_01,(long)addr_00 - (long)addr_01);
        }
        if (size_00 != uVar1) {
          os_pages_unmap((void *)(size + (long)addr_00),size_00 - uVar1);
        }
      }
    }
  }
  return addr_00;
}

Assistant:

void *
pages_map(void *addr, size_t size, size_t alignment, bool *commit) {
	assert(alignment >= PAGE);
	assert(ALIGNMENT_ADDR2BASE(addr, alignment) == addr);

#if defined(__FreeBSD__) && defined(MAP_EXCL)
	/*
	 * FreeBSD has mechanisms both to mmap at specific address without
	 * touching existing mappings, and to mmap with specific alignment.
	 */
	{
		if (os_overcommits) {
			*commit = true;
		}

		int prot = *commit ? PAGES_PROT_COMMIT : PAGES_PROT_DECOMMIT;
		int flags = mmap_flags;

		if (addr != NULL) {
			flags |= MAP_FIXED | MAP_EXCL;
		} else {
			unsigned alignment_bits = ffs_zu(alignment);
			assert(alignment_bits > 0);
			flags |= MAP_ALIGNED(alignment_bits);
		}

		void *ret = mmap(addr, size, prot, flags, -1, 0);
		if (ret == MAP_FAILED) {
			ret = NULL;
		}

		return ret;
	}
#endif
	/*
	 * Ideally, there would be a way to specify alignment to mmap() (like
	 * NetBSD has), but in the absence of such a feature, we have to work
	 * hard to efficiently create aligned mappings.  The reliable, but
	 * slow method is to create a mapping that is over-sized, then trim the
	 * excess.  However, that always results in one or two calls to
	 * os_pages_unmap(), and it can leave holes in the process's virtual
	 * memory map if memory grows downward.
	 *
	 * Optimistically try mapping precisely the right amount before falling
	 * back to the slow method, with the expectation that the optimistic
	 * approach works most of the time.
	 */

	void *ret = os_pages_map(addr, size, os_page, commit);
	if (ret == NULL || ret == addr) {
		return ret;
	}
	assert(addr == NULL);
	if (ALIGNMENT_ADDR2OFFSET(ret, alignment) != 0) {
		os_pages_unmap(ret, size);
		return pages_map_slow(size, alignment, commit);
	}

	assert(PAGE_ADDR2BASE(ret) == ret);
	return ret;
}